

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O2

void __thiscall
FilmGrainTableTest_AddSingleSegmentRemoveBiggerSegment_Test::
~FilmGrainTableTest_AddSingleSegmentRemoveBiggerSegment_Test
          (FilmGrainTableTest_AddSingleSegmentRemoveBiggerSegment_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST(FilmGrainTableTest, AddSingleSegmentRemoveBiggerSegment) {
  aom_film_grain_table_t table;
  aom_film_grain_t grain;

  memset(&table, 0, sizeof(table));

  aom_film_grain_table_append(&table, 0, 1000, film_grain_test_vectors + 0);
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 0, 1100, true, &grain));

  EXPECT_EQ(nullptr, table.head);
  EXPECT_EQ(nullptr, table.tail);
  aom_film_grain_table_free(&table);
}